

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O0

int detect_form(archive_read *a,int *is_form_d)

{
  int iVar1;
  char **b;
  int *last_is_path_00;
  ssize_t *avail_00;
  archive_read *in_RSI;
  bool bVar2;
  int keywords;
  int last_is_path;
  int form_D;
  int multiline;
  int entry_cnt;
  ssize_t nl;
  ssize_t len;
  ssize_t detected_bytes;
  ssize_t ravail;
  ssize_t avail;
  char *p;
  size_t in_stack_ffffffffffffff98;
  undefined2 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa2;
  undefined1 in_stack_ffffffffffffffa3;
  undefined4 in_stack_ffffffffffffffa4;
  int in_stack_ffffffffffffffa8;
  int unset;
  int iVar3;
  int iVar4;
  char *in_stack_ffffffffffffffb8;
  ssize_t *nl_00;
  ssize_t *in_stack_ffffffffffffffd8;
  
  nl_00 = (ssize_t *)0x0;
  iVar4 = 0;
  iVar3 = 0;
  unset = 0;
  if (in_RSI != (archive_read *)0x0) {
    (in_RSI->archive).magic = 0;
  }
  b = (char **)__archive_read_ahead
                         ((archive_read *)
                          CONCAT44(in_stack_ffffffffffffffa4,
                                   CONCAT13(in_stack_ffffffffffffffa3,
                                            CONCAT12(in_stack_ffffffffffffffa2,
                                                     in_stack_ffffffffffffffa0))),
                          in_stack_ffffffffffffff98,(ssize_t *)0x156166);
  avail_00 = in_stack_ffffffffffffffd8;
  if (b == (char **)0x0) {
    return -1;
  }
  while ((last_is_path_00 = (int *)next_line(in_RSI,b,avail_00,in_stack_ffffffffffffffd8,nl_00),
         0 < (long)last_is_path_00 && (in_stack_ffffffffffffffb8 != (char *)0x0))) {
    if (iVar3 == 0) {
      while( true ) {
        bVar2 = false;
        if ((0 < (long)last_is_path_00) && (bVar2 = true, *(char *)b != ' ')) {
          bVar2 = *(char *)b == '\t';
        }
        if (!bVar2) break;
        b = (char **)((long)b + 1);
        avail_00 = (ssize_t *)((long)avail_00 + -1);
        last_is_path_00 = (int *)((long)last_is_path_00 + -1);
      }
      if (((*(char *)b == '#') || (*(char *)b == '\n')) || (*(char *)b == '\r')) {
        b = (char **)((long)last_is_path_00 + (long)b);
        avail_00 = (ssize_t *)((long)avail_00 - (long)last_is_path_00);
      }
      else {
        if (*(char *)b == '/') {
          iVar1 = strncmp((char *)b,"/set",4);
          if (iVar1 == 0) {
            iVar1 = bid_keyword_list(in_stack_ffffffffffffffb8,CONCAT44(iVar4,iVar3),unset,
                                     in_stack_ffffffffffffffa8);
            if (iVar1 < 1) break;
            if (*(char *)((long)b + (long)last_is_path_00 + (-1 - (long)in_stack_ffffffffffffffb8))
                == '\\') {
              iVar3 = 2;
            }
          }
          else {
            iVar1 = strncmp((char *)b,"/unset",6);
            if ((iVar1 != 0) ||
               (iVar1 = bid_keyword_list(in_stack_ffffffffffffffb8,CONCAT44(iVar4,iVar3),unset,
                                         in_stack_ffffffffffffffa8), iVar1 < 1)) break;
            if (*(char *)((long)b + (long)last_is_path_00 + (-1 - (long)in_stack_ffffffffffffffb8))
                == '\\') {
              iVar3 = 2;
            }
          }
        }
        else {
          iVar1 = bid_entry((char *)avail_00,(ssize_t)in_stack_ffffffffffffffd8,(ssize_t)nl_00,
                            last_is_path_00);
          if (iVar1 < 0) break;
          nl_00 = (ssize_t *)((long)last_is_path_00 + (long)nl_00);
          if (unset == 0) {
            if (in_stack_ffffffffffffffa8 == 0) {
              if (0 < iVar1) {
                unset = -1;
              }
            }
            else {
              unset = 1;
            }
          }
          else if (((unset == 1) && (in_stack_ffffffffffffffa8 == 0)) && (0 < iVar1)) break;
          if ((in_stack_ffffffffffffffa8 == 0) &&
             (*(char *)((long)b + (long)last_is_path_00 + (-1 - (long)in_stack_ffffffffffffffb8)) ==
              '\\')) {
            iVar3 = 1;
          }
          else {
            iVar4 = iVar4 + 1;
            if (2 < iVar4) break;
          }
        }
        b = (char **)((long)last_is_path_00 + (long)b);
        avail_00 = (ssize_t *)((long)avail_00 - (long)last_is_path_00);
      }
    }
    else {
      iVar1 = bid_keyword_list(in_stack_ffffffffffffffb8,CONCAT44(iVar4,iVar3),unset,
                               in_stack_ffffffffffffffa8);
      if (iVar1 < 1) break;
      if (iVar3 == 1) {
        nl_00 = (ssize_t *)((long)last_is_path_00 + (long)nl_00);
      }
      if (*(char *)((long)b + (long)last_is_path_00 + (-1 - (long)in_stack_ffffffffffffffb8)) !=
          '\\') {
        if ((iVar3 == 1) && (iVar4 = iVar4 + 1, 2 < iVar4)) break;
        iVar3 = 0;
      }
      b = (char **)((long)last_is_path_00 + (long)b);
      avail_00 = (ssize_t *)((long)avail_00 - (long)last_is_path_00);
    }
  }
  if ((iVar4 < 3) && ((iVar4 < 1 || (last_is_path_00 != (int *)0x0)))) {
    return 0;
  }
  if ((in_RSI != (archive_read *)0x0) && (unset == 1)) {
    (in_RSI->archive).magic = 1;
  }
  return 0x20;
}

Assistant:

static int
detect_form(struct archive_read *a, int *is_form_d)
{
	const char *p;
	ssize_t avail, ravail;
	ssize_t detected_bytes = 0, len, nl;
	int entry_cnt = 0, multiline = 0;
	int form_D = 0;/* The archive is generated by `NetBSD mtree -D'
			* (In this source we call it `form D') . */

	if (is_form_d != NULL)
		*is_form_d = 0;
	p = __archive_read_ahead(a, 1, &avail);
	if (p == NULL)
		return (-1);
	ravail = avail;
	for (;;) {
		len = next_line(a, &p, &avail, &ravail, &nl);
		/* The terminal character of the line should be
		 * a new line character, '\r\n' or '\n'. */
		if (len <= 0 || nl == 0)
			break;
		if (!multiline) {
			/* Leading whitespace is never significant,
			 * ignore it. */
			while (len > 0 && (*p == ' ' || *p == '\t')) {
				++p;
				--avail;
				--len;
			}
			/* Skip comment or empty line. */ 
			if (p[0] == '#' || p[0] == '\n' || p[0] == '\r') {
				p += len;
				avail -= len;
				continue;
			}
		} else {
			/* A continuance line; the terminal
			 * character of previous line was '\' character. */
			if (bid_keyword_list(p, len, 0, 0) <= 0)
				break;
			if (multiline == 1)
				detected_bytes += len;
			if (p[len-nl-1] != '\\') {
				if (multiline == 1 &&
				    ++entry_cnt >= MAX_BID_ENTRY)
					break;
				multiline = 0;
			}
			p += len;
			avail -= len;
			continue;
		}
		if (p[0] != '/') {
			int last_is_path, keywords;

			keywords = bid_entry(p, len, nl, &last_is_path);
			if (keywords >= 0) {
				detected_bytes += len;
				if (form_D == 0) {
					if (last_is_path)
						form_D = 1;
					else if (keywords > 0)
						/* This line is not `form D'. */
						form_D = -1;
				} else if (form_D == 1) {
					if (!last_is_path && keywords > 0)
						/* This this is not `form D'
						 * and We cannot accept mixed
						 * format. */
						break;
				}
				if (!last_is_path && p[len-nl-1] == '\\')
					/* This line continues. */
					multiline = 1;
				else {
					/* We've got plenty of correct lines
					 * to assume that this file is a mtree
					 * format. */
					if (++entry_cnt >= MAX_BID_ENTRY)
						break;
				}
			} else
				break;
		} else if (strncmp(p, "/set", 4) == 0) {
			if (bid_keyword_list(p+4, len-4, 0, 0) <= 0)
				break;
			/* This line continues. */
			if (p[len-nl-1] == '\\')
				multiline = 2;
		} else if (strncmp(p, "/unset", 6) == 0) {
			if (bid_keyword_list(p+6, len-6, 1, 0) <= 0)
				break;
			/* This line continues. */
			if (p[len-nl-1] == '\\')
				multiline = 2;
		} else
			break;

		/* Test next line. */
		p += len;
		avail -= len;
	}
	if (entry_cnt >= MAX_BID_ENTRY || (entry_cnt > 0 && len == 0)) {
		if (is_form_d != NULL) {
			if (form_D == 1)
				*is_form_d = 1;
		}
		return (32);
	}

	return (0);
}